

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O0

int to_private_key(char *bip38,uchar *bytes,size_t bytes_len,uchar *pass,size_t pass_len,
                  uint32_t flags,uchar *bytes_out,size_t len)

{
  uchar *bytes_00;
  uint32_t uVar1;
  size_t bytes_len_00;
  uchar *local_e0;
  char *addr58;
  uchar network;
  bip38_sublayout_t normal;
  size_t written;
  undefined1 local_a0;
  uchar local_9f;
  char local_9e;
  byte local_9d;
  int ret;
  bip38_layout_t buf;
  derived_t derived;
  uint32_t flags_local;
  size_t pass_len_local;
  uchar *pass_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  char *bip38_local;
  
  written._4_4_ = -2;
  derived.half2._24_4_ = flags;
  unique0x10000360 = pass_len;
  if (((flags & 0xffffe010) != 0) ||
     (((flags & 0x400) == 0 && ((bytes_out == (uchar *)0x0 || (len != 0x20)))))) goto LAB_00166838;
  if (bytes == (uchar *)0x0) {
    written._4_4_ = wally_base58_to_bytes(bip38,1,&local_9f,0x2b,(size_t *)(normal.half2 + 8));
    if (written._4_4_ != 0) goto LAB_00166838;
    if (normal.half2._8_8_ != 0x27) {
      written._4_4_ = -2;
      goto LAB_00166838;
    }
  }
  else {
    if (bytes_len != 0x27) goto LAB_00166838;
    memcpy(&local_9f,bytes,0x27);
  }
  if ((derived.half2._24_4_ & 0x1000) != 0) {
    addr58._4_4_ = buf.u._24_4_;
    normal.half1[0] = buf.u._0_1_;
    normal.half1[1] = buf.u._1_1_;
    normal.half1[2] = buf.u._2_1_;
    normal.half1[3] = buf.u._3_1_;
    normal.half1[4] = buf.u._4_1_;
    normal.half1[5] = buf.u._5_1_;
    normal.half1[6] = buf.u._6_1_;
    normal.half1[7] = buf.u._7_1_;
    normal.half1[8] = buf.u._8_1_;
    normal.half1[9] = buf.u._9_1_;
    normal.half1[10] = buf.u._10_1_;
    normal.half1[0xb] = buf.u._11_1_;
    normal.half1[0xc] = buf.u._12_1_;
    normal.half1[0xd] = buf.u._13_1_;
    normal.half1[0xe] = buf.u._14_1_;
    normal.half1[0xf] = buf.u._15_1_;
    normal.half2[0] = buf.u._16_1_;
    normal.half2[1] = buf.u._17_1_;
    normal.half2[2] = buf.u._18_1_;
    normal.half2[3] = buf.u._19_1_;
    normal.half2[4] = buf.u._20_1_;
    normal.half2[5] = buf.u._21_1_;
    normal.half2[6] = buf.u._22_1_;
    normal.half2[7] = buf.u._23_1_;
    memcpy(&ret,(void *)((long)&addr58 + 4),0x24);
    wally_clear((void *)((long)&addr58 + 4),0x24);
  }
  if ((((local_9f == '\x01') && ((local_9d & 0x1b) == 0)) && ((local_9d & 0xc0) == 0xc0)) &&
     ((local_9e == 'B' && ((local_9d & 4) == 0)))) {
    if ((derived.half2._24_4_ & 0x400) == 0) {
      written._4_4_ =
           wally_scrypt(pass,stack0xffffffffffffffd0,(uchar *)&ret,4,0x4000,8,8,
                        buf.u.normal.half2 + 0xc,0x40);
      if (written._4_4_ == 0) {
        aes_dec_impl(&buf.pad1,buf.u.normal.half2 + 0xc,derived.half1_hi + 8,bytes_out);
        aes_dec_impl(buf.u.normal.half1 + 8,derived.half1_lo + 8,derived.half1_hi + 8,
                     bytes_out + 0x10);
        if ((derived.half2._24_4_ & 0x800) == 0) {
          addr58._3_1_ = derived.half2[0x18];
          local_e0 = (uchar *)0x0;
          written._4_4_ =
               address_from_private_key
                         (bytes_out,len,addr58._3_1_,(local_9d & 0x20) != 0,(char **)&local_e0);
          bytes_00 = local_e0;
          if (written._4_4_ == 0) {
            bytes_len_00 = strlen((char *)local_e0);
            uVar1 = base58_get_checksum(bytes_00,bytes_len_00);
            if (ret != uVar1) {
              written._4_4_ = -2;
            }
          }
          wally_free_string((char *)local_e0);
        }
        else {
          uVar1 = base58_get_checksum(bytes_out,len);
          if (ret != uVar1) {
            written._4_4_ = -2;
          }
        }
      }
    }
    else {
      written._4_4_ = 0;
    }
  }
  else {
    written._4_4_ = -2;
  }
LAB_00166838:
  wally_clear_2((void *)((long)&buf.u + 0x20),0x40,&local_a0,0x2c);
  return written._4_4_;
}

Assistant:

static int to_private_key(const char *bip38,
                          const unsigned char *bytes, size_t bytes_len,
                          const unsigned char *pass, size_t pass_len,
                          uint32_t flags,
                          unsigned char *bytes_out, size_t len)
{
    struct derived_t derived;
    struct bip38_layout_t buf;
    int ret = WALLY_EINVAL;

    if (flags & ~BIP38_ALL_DEFINED_FLAGS)
        goto finish;

    if (!(flags & BIP38_KEY_QUICK_CHECK) &&
        (!bytes_out || len != EC_PRIVATE_KEY_LEN))
        goto finish;

    if (bytes) {
        if (bytes_len != BIP38_SERIALIZED_LEN)
            goto finish;
        memcpy(&buf.prefix, bytes, BIP38_SERIALIZED_LEN);
    } else {
        size_t written;
        if ((ret = wally_base58_to_bytes(bip38, BASE58_FLAG_CHECKSUM, &buf.prefix,
                                         BIP38_SERIALIZED_LEN + BASE58_CHECKSUM_LEN,
                                         &written)))
            goto finish;

        if (written != BIP38_SERIALIZED_LEN) {
            ret = WALLY_EINVAL;
            goto finish;
        }
    }

    if (flags & BIP38_KEY_SWAP_ORDER) {
        /* Shuffle hash from the end to the beginning (swapped->normal) */
        struct bip38_sublayout_t normal;
        normal.hash = buf.u.swapped.hash;
        memcpy(normal.half1, buf.u.swapped.half1, sizeof(buf.u.swapped.half1));
        memcpy(normal.half2, buf.u.swapped.half2, sizeof(buf.u.swapped.half2));
        memcpy(&buf.u.normal, &normal, sizeof(normal));
        wally_clear(&normal, sizeof(normal));
    }

    if (buf.prefix != BIP38_PREFIX ||
        buf.flags & BIP38_FLAGS_RESERVED ||
        (buf.flags & BIP38_FLAG_DEFAULT) != BIP38_FLAG_DEFAULT ||
        buf.ec_type != BIP38_NO_ECMUL /* FIXME: EC Mul support */ ||
        buf.flags & BIP38_FLAG_HAVE_LOT) {
        ret = WALLY_EINVAL;
        goto finish;
    }

    if (flags & BIP38_KEY_QUICK_CHECK) {
        ret = WALLY_OK;
        goto finish;
    }

    if((ret = wally_scrypt(pass, pass_len,
                           (unsigned char *)&buf.u.normal.hash, sizeof(buf.u.normal.hash), 16384, 8, 8,
                           (unsigned char *)&derived, sizeof(derived))))
        goto finish;

    aes_dec_impl(buf.u.normal.half1, derived.half1_lo, derived.half2, bytes_out + 0);
    aes_dec_impl(buf.u.normal.half2, derived.half1_hi, derived.half2, bytes_out + 16);

    if (flags & BIP38_KEY_RAW_MODE) {
        if (buf.u.normal.hash != base58_get_checksum(bytes_out, len))
            ret = WALLY_EINVAL;
    } else {
        const unsigned char network = flags & 0xff;
        char *addr58 = NULL;
        ret = address_from_private_key(bytes_out, len, network,
                                       buf.flags & BIP38_FLAG_COMPRESSED, &addr58);
        if (!ret &&
            buf.u.normal.hash != base58_get_checksum((unsigned char *)addr58, strlen(addr58)))
            ret = WALLY_EINVAL;
        wally_free_string(addr58);
    }

finish:
    wally_clear_2(&derived, sizeof(derived), &buf, sizeof(buf));
    return ret;
}